

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O3

bool GenerateAuthCookie(string *cookie_out,optional<std::filesystem::perms> cookie_perms)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  path src;
  path dest;
  char cVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  perms p;
  undefined8 uVar6;
  long in_FS_OFFSET;
  Span<unsigned_char> bytes;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  Span<const_unsigned_char> s;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  error_code code;
  path filepath;
  path filepath_tmp;
  ofstream file;
  string cookie;
  uchar rand_pwd [32];
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  char *in_stack_fffffffffffffc90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc98;
  undefined8 in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca8;
  int iVar7;
  undefined4 in_stack_fffffffffffffcac;
  _Alloc_hider _Var8;
  error_category *in_stack_fffffffffffffcb0;
  undefined8 in_stack_fffffffffffffcb8;
  undefined8 in_stack_fffffffffffffcc0;
  _Alloc_hider in_stack_fffffffffffffcc8;
  _Alloc_hider _Var9;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> in_stack_fffffffffffffcd0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  path local_318;
  path local_2f0;
  path local_2c8;
  path local_2a0;
  undefined1 local_278 [8];
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268 [14];
  ios_base local_180 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  uchar local_58 [40];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bytes.m_size = 0x20;
  bytes.m_data = local_58;
  GetRandBytes(bytes);
  local_278 = (undefined1  [8])local_268;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_278,COOKIEAUTH_USER_abi_cxx11_._M_dataplus._M_p,
             COOKIEAUTH_USER_abi_cxx11_._M_dataplus._M_p +
             COOKIEAUTH_USER_abi_cxx11_._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,":");
  s.m_size = 0x20;
  s.m_data = local_58;
  HexStr_abi_cxx11_(&local_2a0._M_pathname,s);
  uVar6 = 0xf;
  if (local_278 != (undefined1  [8])local_268) {
    uVar6 = local_268[0]._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_2a0._M_pathname._M_string_length + local_270) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_pathname._M_dataplus._M_p != &local_2a0._M_pathname.field_2) {
      uVar6 = local_2a0._M_pathname.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_2a0._M_pathname._M_string_length + local_270) goto LAB_00152321;
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_2a0._M_pathname,0,0,(char *)local_278,local_270);
  }
  else {
LAB_00152321:
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_278,local_2a0._M_pathname._M_dataplus._M_p,
                       local_2a0._M_pathname._M_string_length);
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar1 = &pbVar5->field_2;
  if (paVar2 == paVar1) {
    local_78.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_78.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_78._M_dataplus._M_p = (pointer)paVar2;
  }
  local_78._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar5->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_pathname._M_dataplus._M_p != &local_2a0._M_pathname.field_2) {
    operator_delete(local_2a0._M_pathname._M_dataplus._M_p,
                    local_2a0._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if (local_278 != (undefined1  [8])local_268) {
    operator_delete((void *)local_278,local_268[0]._M_allocated_capacity + 1);
  }
  std::ofstream::ofstream(local_278);
  GetAuthCookieFile((path *)&local_2a0,true);
  std::ofstream::open(local_278,(_Ios_Openmode)local_2a0._M_pathname._M_dataplus._M_p);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    paVar1 = &local_2c8._M_pathname.field_2;
    local_2c8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2c8,local_2a0._M_pathname._M_dataplus._M_p,
               local_2a0._M_pathname._M_dataplus._M_p + local_2a0._M_pathname._M_string_length);
    logging_function_00._M_str = "GenerateAuthCookie";
    logging_function_00._M_len = 0x12;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/request.cpp";
    source_file_00._M_len = 0x58;
    LogPrintf_<std::__cxx11::string>
              (logging_function_00,source_file_00,0x6f,
               LEVELDB|QT|LIBEVENT|PROXY|PRUNE|RAND|CMPCTBLOCK|REINDEX|ESTIMATEFEE|ZMQ,
               (Level)&local_2c8,in_stack_fffffffffffffc90,in_stack_fffffffffffffc98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_2c8._M_pathname._M_dataplus._M_p,
                      local_2c8._M_pathname.field_2._M_allocated_capacity + 1);
    }
    bVar4 = false;
    goto LAB_001527af;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,local_78._M_dataplus._M_p,local_78._M_string_length);
  std::ofstream::close();
  GetAuthCookieFile((path *)&local_2c8,false);
  std::filesystem::__cxx11::path::path(&local_2f0,&local_2a0);
  std::filesystem::__cxx11::path::path(&local_318,&local_2c8);
  src.super_path._M_pathname._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffc8c;
  src.super_path._M_pathname._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffc88;
  src.super_path._M_pathname._M_string_length = (size_type)in_stack_fffffffffffffc90;
  src.super_path._M_pathname.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffc98;
  src.super_path._M_pathname.field_2._8_8_ = in_stack_fffffffffffffca0;
  src.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl._0_4_ =
       in_stack_fffffffffffffca8;
  src.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl._4_4_ =
       in_stack_fffffffffffffcac;
  dest.super_path._M_pathname._M_string_length = in_stack_fffffffffffffcb8;
  dest.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffcb0;
  dest.super_path._M_pathname.field_2._M_allocated_capacity = in_stack_fffffffffffffcc0;
  dest.super_path._M_pathname.field_2._8_8_ = in_stack_fffffffffffffcc8._M_p;
  dest.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )in_stack_fffffffffffffcd0._M_head_impl;
  bVar4 = RenameOver(src,dest);
  std::filesystem::__cxx11::path::~path(&local_318);
  std::filesystem::__cxx11::path::~path(&local_2f0);
  if (bVar4) {
    if (((ulong)cookie_perms.super__Optional_base<std::filesystem::perms,_true,_true>._M_payload.
                super__Optional_payload_base<std::filesystem::perms> >> 0x20 & 1) != 0) {
      iVar7 = 0;
      std::_V2::system_category();
      std::filesystem::permissions
                (&local_2c8,
                 cookie_perms.super__Optional_base<std::filesystem::perms,_true,_true>._M_payload.
                 super__Optional_payload_base<std::filesystem::perms>._M_payload,replace,
                 (error_code *)&stack0xfffffffffffffca8);
      if (iVar7 != 0) {
        _Var9._M_p = (pointer)&local_328;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffcc8,local_2a0._M_pathname._M_dataplus._M_p,
                   local_2a0._M_pathname._M_dataplus._M_p + local_2a0._M_pathname._M_string_length);
        logging_function._M_str = "GenerateAuthCookie";
        logging_function._M_len = 0x12;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/request.cpp"
        ;
        source_file._M_len = 0x58;
        LogPrintf_<std::__cxx11::string>
                  (logging_function,source_file,0x7e,
                   LEVELDB|QT|LIBEVENT|PROXY|PRUNE|RAND|CMPCTBLOCK|REINDEX|ESTIMATEFEE|RPC|BENCH,
                   (Level)(string *)&stack0xfffffffffffffcc8,in_stack_fffffffffffffc90,
                   in_stack_fffffffffffffc98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != &local_328) goto LAB_0015269c;
        goto LAB_001526a9;
      }
    }
    g_generated_cookie = 1;
    _Var9._M_p = (pointer)&local_328;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffcc8,local_2c8._M_pathname._M_dataplus._M_p,
               local_2c8._M_pathname._M_dataplus._M_p + local_2c8._M_pathname._M_string_length);
    logging_function_02._M_str = "GenerateAuthCookie";
    logging_function_02._M_len = 0x12;
    source_file_02._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/request.cpp";
    source_file_02._M_len = 0x58;
    LogPrintf_<std::__cxx11::string>
              (logging_function_02,source_file_02,0x84,
               LEVELDB|QT|LIBEVENT|PROXY|PRUNE|RAND|CMPCTBLOCK|REINDEX|ESTIMATEFEE|RPC|WALLETDB|HTTP
               |MEMPOOL,(Level)(string *)&stack0xfffffffffffffcc8,in_stack_fffffffffffffc90,
               in_stack_fffffffffffffc98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var9._M_p != &local_328) {
      operator_delete(_Var9._M_p,local_328._M_allocated_capacity + 1);
    }
    std::filesystem::status(&local_2c8);
    PermsToSymbolicString_abi_cxx11_((string *)&stack0xfffffffffffffcc8,p);
    logging_function_03._M_str = "GenerateAuthCookie";
    logging_function_03._M_len = 0x12;
    source_file_03._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/request.cpp";
    source_file_03._M_len = 0x58;
    LogPrintf_<std::__cxx11::string>
              (logging_function_03,source_file_03,0x85,
               LEVELDB|QT|LIBEVENT|PROXY|PRUNE|RAND|CMPCTBLOCK|REINDEX|ESTIMATEFEE|RPC|WALLETDB|ZMQ|
               BENCH|MEMPOOL,(Level)(string *)&stack0xfffffffffffffcc8,in_stack_fffffffffffffc90,
               in_stack_fffffffffffffc98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var9._M_p != &local_328) {
      operator_delete(_Var9._M_p,local_328._M_allocated_capacity + 1);
    }
    bVar4 = true;
    if (cookie_out != (string *)0x0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (cookie_out,&local_78);
    }
  }
  else {
    _Var9._M_p = (pointer)&local_328;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffcc8,local_2a0._M_pathname._M_dataplus._M_p,
               local_2a0._M_pathname._M_dataplus._M_p + local_2a0._M_pathname._M_string_length);
    _Var8._M_p = &stack0xfffffffffffffcb8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffca8,local_2c8._M_pathname._M_dataplus._M_p,
               local_2c8._M_pathname._M_dataplus._M_p + local_2c8._M_pathname._M_string_length);
    logging_function_01._M_str = "GenerateAuthCookie";
    logging_function_01._M_len = 0x12;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/request.cpp";
    source_file_01._M_len = 0x58;
    LogPrintf_<std::__cxx11::string,std::__cxx11::string>
              (logging_function_01,source_file_01,0x77,ALL,Info,
               "Unable to rename cookie authentication file %s to %s\n",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xfffffffffffffcc8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xfffffffffffffca8);
    if (_Var8._M_p != &stack0xfffffffffffffcb8) {
      operator_delete(_Var8._M_p,in_stack_fffffffffffffcb8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var9._M_p != &local_328) {
LAB_0015269c:
      operator_delete(_Var9._M_p,local_328._M_allocated_capacity + 1);
    }
LAB_001526a9:
    bVar4 = false;
  }
  std::filesystem::__cxx11::path::~path(&local_2c8);
LAB_001527af:
  std::filesystem::__cxx11::path::~path(&local_2a0);
  local_278 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_278 + *(long *)(_VTT + -0x18)) = __M_insert<void_const*>;
  std::filebuf::~filebuf((filebuf *)&local_270);
  std::ios_base::~ios_base(local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool GenerateAuthCookie(std::string* cookie_out, std::optional<fs::perms> cookie_perms)
{
    const size_t COOKIE_SIZE = 32;
    unsigned char rand_pwd[COOKIE_SIZE];
    GetRandBytes(rand_pwd);
    std::string cookie = COOKIEAUTH_USER + ":" + HexStr(rand_pwd);

    /** the umask determines what permissions are used to create this file -
     * these are set to 0077 in common/system.cpp.
     */
    std::ofstream file;
    fs::path filepath_tmp = GetAuthCookieFile(true);
    file.open(filepath_tmp);
    if (!file.is_open()) {
        LogInfo("Unable to open cookie authentication file %s for writing\n", fs::PathToString(filepath_tmp));
        return false;
    }
    file << cookie;
    file.close();

    fs::path filepath = GetAuthCookieFile(false);
    if (!RenameOver(filepath_tmp, filepath)) {
        LogInfo("Unable to rename cookie authentication file %s to %s\n", fs::PathToString(filepath_tmp), fs::PathToString(filepath));
        return false;
    }
    if (cookie_perms) {
        std::error_code code;
        fs::permissions(filepath, cookie_perms.value(), fs::perm_options::replace, code);
        if (code) {
            LogInfo("Unable to set permissions on cookie authentication file %s\n", fs::PathToString(filepath_tmp));
            return false;
        }
    }

    g_generated_cookie = true;
    LogInfo("Generated RPC authentication cookie %s\n", fs::PathToString(filepath));
    LogInfo("Permissions used for cookie: %s\n", PermsToSymbolicString(fs::status(filepath).permissions()));

    if (cookie_out)
        *cookie_out = cookie;
    return true;
}